

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

void __thiscall
VPLGrammar::Parser::CallOpNode::BuildProgram(CallOpNode *this,Scope *scope,ostream *out)

{
  size_type sVar1;
  const_reference this_00;
  pointer pAVar2;
  int local_24;
  int i;
  ostream *out_local;
  Scope *scope_local;
  CallOpNode *this_local;
  
  sVar1 = std::
          vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
          ::size(&(this->super_ASTNodeBasic).children_);
  vpl::Scope::CheckArgCnt(scope,sVar1);
  sVar1 = std::
          vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
          ::size(&(this->super_ASTNodeBasic).children_);
  local_24 = (int)sVar1;
  while (local_24 = local_24 + -1, -1 < local_24) {
    this_00 = std::
              vector<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>,_std::allocator<std::unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>_>_>
              ::operator[](&(this->super_ASTNodeBasic).children_,(long)local_24);
    pAVar2 = std::
             unique_ptr<VPLGrammar::ASTNodeBasic,_std::default_delete<VPLGrammar::ASTNodeBasic>_>::
             operator->(this_00);
    (*pAVar2->_vptr_ASTNodeBasic[5])(pAVar2,scope,out);
  }
  return;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                scope->CheckArgCnt(children_.size());
                for (int i = children_.size() - 1; i >= 0; --i) {
                    children_[i]->BuildProgram(scope, out);
                }
            }